

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

bool __thiscall
ICM::Function::Signature::checkType
          (Signature *this,vector<ICM::TypeObject,_std::allocator<ICM::TypeObject>_> *argT)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  RIterator<unsigned_long> __end2;
  
  uVar4 = (*(long *)(argT + 8) - *(long *)argT) / 0x18;
  uVar1 = (this->InType)._capacity;
  if (this->last_is_args == true) {
    if (uVar4 < uVar1) {
      return false;
    }
    uVar4 = uVar1 - 1;
  }
  else if (uVar4 != uVar1) {
    return false;
  }
  lVar6 = uVar4 + 1;
  lVar5 = 0;
  do {
    lVar6 = lVar6 + -1;
    if (lVar6 == 0) {
      if (this->last_is_args != true) {
        return true;
      }
      lVar5 = ((*(long *)(argT + 8) - *(long *)argT) / 0x18 - uVar4) + 1;
      lVar6 = uVar4 * 0x18;
      do {
        lVar5 = lVar5 + -1;
        bVar2 = lVar5 == 0;
        if (bVar2) {
          return bVar2;
        }
        bVar3 = TypeObject::checkType
                          ((this->InType)._data.
                           super___shared_ptr<ICM::TypeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                           ((this->InType)._capacity - 1),(TypeObject *)(lVar6 + *(long *)argT));
        lVar6 = lVar6 + 0x18;
      } while (bVar3);
      return bVar2;
    }
    bVar2 = TypeObject::checkType
                      ((TypeObject *)
                       ((long)&((this->InType)._data.
                                super___shared_ptr<ICM::TypeObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->type + lVar5),(TypeObject *)(lVar5 + *(long *)argT));
    lVar5 = lVar5 + 0x18;
  } while (bVar2);
  return false;
}

Assistant:

bool Signature::checkType(const vector<TypeObject> &argT) const {
			// Check Size
			if (last_is_args) {
				if (argT.size() < InType.size())
					return false;
			}
			else if (argT.size() != InType.size()) {
				return false;
			}
			// Check Type
			size_t size = last_is_args ? InType.size() - 1 : InType.size();
			for (auto i : Range<size_t>(0, size))
				if (!InType[i].checkType(argT[i]))
					return false;
			if (last_is_args) {
				for (auto i : Range<size_t>(size, argT.size()))
					if (!InType.back().checkType(argT[i]))
						return false;
			}
			return true;
		}